

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O2

void __thiscall TaprootScriptTree_TreeTest2_Test::TestBody(TaprootScriptTree_TreeTest2_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  ScriptBuilder *pSVar2;
  pointer pTVar3;
  pointer pTVar4;
  long lVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ScopedTrace gtest_trace_385;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  allocator local_9bf;
  allocator local_9be;
  allocator local_9bd;
  allocator local_9bc;
  allocator local_9bb;
  allocator local_9ba;
  allocator local_9b9;
  char *exp_str;
  TaprootScriptTree tree_b;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9a8 [17];
  AssertionResult gtest_ar_13;
  TaprootScriptTree tree;
  char *exp_hash;
  vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_> exp_list;
  string nodes;
  SchnorrPubkey schnorr_pubkey2;
  SchnorrPubkey schnorr_pubkey1;
  Pubkey pubkey1;
  ByteData256 tweak2;
  ByteData256 tweak1;
  SchnorrPubkey schnorr_pubkey32;
  SchnorrPubkey schnorr_pubkey3;
  SchnorrPubkey schnorr_pubkey11;
  SchnorrPubkey schnorr_pubkey31;
  SchnorrPubkey schnorr_pubkey22;
  SchnorrPubkey schnorr_pubkey21;
  SchnorrPubkey schnorr_pubkey12;
  Pubkey pubkey3;
  Pubkey pubkey2;
  ByteData256 tweak4;
  ByteData256 tweak3;
  TaprootScriptTree tree_efg;
  Script local_628;
  undefined8 local_5f0;
  string local_5e8 [32];
  string local_5c8 [32];
  Script local_5a8;
  undefined8 local_570;
  string local_568 [32];
  string local_548 [32];
  Script local_528;
  undefined8 local_4f0;
  string local_4e8 [32];
  string local_4c8 [32];
  Script local_4a8;
  undefined8 local_470;
  string local_468 [32];
  string local_448 [32];
  Script local_428;
  undefined8 local_3f0;
  string local_3e8 [32];
  string local_3c8 [32];
  Script local_3a8;
  undefined8 local_370;
  string local_368 [32];
  string local_348 [32];
  Script local_328;
  undefined8 local_2f0;
  string local_2e8 [32];
  string local_2c8 [32];
  Script local_2a8;
  undefined8 local_270;
  string local_268 [32];
  Privkey key;
  Script script_j;
  Script script_h;
  Script script_g;
  Script script_f;
  Script script_e;
  Script script_d;
  Script script_c;
  Script script_b;
  Script script_a;
  
  std::__cxx11::string::string
            ((string *)&tree_efg,"dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8",
             (allocator *)&tree_b);
  cfd::core::Privkey::Privkey(&key,(string *)&tree_efg,kMainnet,true);
  std::__cxx11::string::~string((string *)&tree_efg);
  std::__cxx11::string::string
            ((string *)&tree_efg,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&tree_b);
  cfd::core::ByteData256::ByteData256(&tweak1,(string *)&tree_efg);
  std::__cxx11::string::~string((string *)&tree_efg);
  std::__cxx11::string::string
            ((string *)&tree_efg,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57",
             (allocator *)&tree_b);
  cfd::core::ByteData256::ByteData256(&tweak2,(string *)&tree_efg);
  std::__cxx11::string::~string((string *)&tree_efg);
  std::__cxx11::string::string
            ((string *)&tree_efg,"a78120a2d338fce91a49230935e8f000672f9511ee6fa5fc35ef22f0dfc89475",
             (allocator *)&tree_b);
  cfd::core::ByteData256::ByteData256(&tweak3,(string *)&tree_efg);
  std::__cxx11::string::~string((string *)&tree_efg);
  std::__cxx11::string::string
            ((string *)&tree_efg,"4b79048979258d39c31b10f2bda70a433daa6e42f987089053f00db1d0f94a8e",
             (allocator *)&tree_b);
  cfd::core::ByteData256::ByteData256(&tweak4,(string *)&tree_efg);
  std::__cxx11::string::~string((string *)&tree_efg);
  cfd::core::Privkey::GeneratePubkey(SUB81(&pubkey1,0));
  cfd::core::operator+(&pubkey2,(ByteData256 *)&pubkey1);
  cfd::core::operator+(&pubkey3,(ByteData256 *)&pubkey1);
  cfd::core::SchnorrPubkey::FromPubkey((Pubkey *)&schnorr_pubkey1,(bool *)&pubkey1);
  cfd::core::operator+(&schnorr_pubkey11,&schnorr_pubkey1.data_);
  cfd::core::operator+(&schnorr_pubkey12,&schnorr_pubkey1.data_);
  cfd::core::SchnorrPubkey::FromPubkey((Pubkey *)&schnorr_pubkey2,(bool *)&pubkey2);
  cfd::core::operator+(&schnorr_pubkey21,&schnorr_pubkey2.data_);
  cfd::core::operator+(&schnorr_pubkey22,&schnorr_pubkey2.data_);
  cfd::core::SchnorrPubkey::FromPubkey((Pubkey *)&schnorr_pubkey3,(bool *)&pubkey3);
  cfd::core::operator+(&schnorr_pubkey31,&schnorr_pubkey3.data_);
  cfd::core::operator+(&schnorr_pubkey32,&schnorr_pubkey3.data_);
  _tree_efg = &PTR__ScriptBuilder_004530b8;
  cfd::core::SchnorrPubkey::GetData();
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_efg,(ByteData *)&tree_b);
  cfd::core::ScriptBuilder::operator<<
            (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_b);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_efg);
  _tree_efg = &PTR__ScriptBuilder_004530b8;
  cfd::core::ScriptBuilder::operator<<
            ((ScriptBuilder *)&tree_efg,(ScriptOperator *)&cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build();
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_efg);
  _tree_efg = &PTR__ScriptBuilder_004530b8;
  cfd::core::SchnorrPubkey::GetData();
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_efg,(ByteData *)&tree_b);
  cfd::core::ScriptBuilder::operator<<
            (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_b);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_efg);
  _tree_efg = &PTR__ScriptBuilder_004530b8;
  cfd::core::SchnorrPubkey::GetData();
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_efg,(ByteData *)&tree_b);
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<
                     (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_CHECKSIGVERIFY);
  cfd::core::SchnorrPubkey::GetData();
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,(ByteData *)&tree);
  cfd::core::ScriptBuilder::operator<<
            (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_b);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_efg);
  _tree_efg = &PTR__ScriptBuilder_004530b8;
  cfd::core::SchnorrPubkey::GetData();
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_efg,(ByteData *)&tree_b);
  cfd::core::ScriptBuilder::operator<<
            (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_b);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_efg);
  _tree_efg = &PTR__ScriptBuilder_004530b8;
  cfd::core::SchnorrPubkey::GetData();
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_efg,(ByteData *)&tree_b);
  cfd::core::ScriptBuilder::operator<<
            (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_b);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_efg);
  _tree_efg = &PTR__ScriptBuilder_004530b8;
  cfd::core::SchnorrPubkey::GetData();
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_efg,(ByteData *)&tree_b);
  cfd::core::ScriptBuilder::operator<<
            (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_b);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_efg);
  _tree_efg = &PTR__ScriptBuilder_004530b8;
  cfd::core::SchnorrPubkey::GetData();
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_efg,(ByteData *)&tree_b);
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<
                     (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_CHECKSIGVERIFY);
  cfd::core::SchnorrPubkey::GetData();
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,(ByteData *)&tree);
  cfd::core::ScriptBuilder::operator<<
            (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_b);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_efg);
  _tree_efg = &PTR__ScriptBuilder_004530b8;
  cfd::core::SchnorrPubkey::GetData();
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&tree_efg,(ByteData *)&tree_b);
  cfd::core::ScriptBuilder::operator<<
            (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree_b);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree_efg);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&tree_b,
             "\"20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac\"",
             "script_a.GetHex()",
             (char (*) [69])"20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_efg);
  std::__cxx11::string::~string((string *)&tree_efg);
  if (tree_b == (TaprootScriptTree)0x0) {
    testing::Message::Message((Message *)&tree_efg);
    if (local_9a8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_9a8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x13d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&tree_efg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_efg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_9a8);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&tree_b,"\"51\"","script_b.GetHex()",(char (*) [3])0x36a841,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_efg);
  std::__cxx11::string::~string((string *)&tree_efg);
  if (tree_b == (TaprootScriptTree)0x0) {
    testing::Message::Message((Message *)&tree_efg);
    if (local_9a8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_9a8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x13e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&tree_efg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_efg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_9a8);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&tree_b,
             "\"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac\"",
             "script_c.GetHex()",
             (char (*) [69])"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_efg);
  std::__cxx11::string::~string((string *)&tree_efg);
  if (tree_b == (TaprootScriptTree)0x0) {
    testing::Message::Message((Message *)&tree_efg);
    if (local_9a8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_9a8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x13f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&tree_efg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_efg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_9a8);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[137],std::__cxx11::string>
            ((internal *)&tree_b,
             "\"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac\""
             ,"script_d.GetHex()",
             (char (*) [137])
             "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_efg);
  std::__cxx11::string::~string((string *)&tree_efg);
  if (tree_b == (TaprootScriptTree)0x0) {
    testing::Message::Message((Message *)&tree_efg);
    if (local_9a8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_9a8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x140,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&tree_efg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_efg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_9a8);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&tree_b,
             "\"20a6573124a479ab188b063bc383aa599da8ccc3b8f90fc18d570a8b367276eaf5ac\"",
             "script_e.GetHex()",
             (char (*) [69])"20a6573124a479ab188b063bc383aa599da8ccc3b8f90fc18d570a8b367276eaf5ac",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_efg);
  std::__cxx11::string::~string((string *)&tree_efg);
  if (tree_b == (TaprootScriptTree)0x0) {
    testing::Message::Message((Message *)&tree_efg);
    if (local_9a8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_9a8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x141,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&tree_efg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_efg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_9a8);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&tree_b,
             "\"2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac\"",
             "script_f.GetHex()",
             (char (*) [69])"2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_efg);
  std::__cxx11::string::~string((string *)&tree_efg);
  if (tree_b == (TaprootScriptTree)0x0) {
    testing::Message::Message((Message *)&tree_efg);
    if (local_9a8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_9a8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x142,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&tree_efg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_efg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_9a8);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&tree_b,
             "\"204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac\"",
             "script_g.GetHex()",
             (char (*) [69])"204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_efg);
  std::__cxx11::string::~string((string *)&tree_efg);
  if (tree_b == (TaprootScriptTree)0x0) {
    testing::Message::Message((Message *)&tree_efg);
    if (local_9a8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_9a8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x143,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&tree_efg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_efg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_9a8);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[137],std::__cxx11::string>
            ((internal *)&tree_b,
             "\"2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac\""
             ,"script_h.GetHex()",
             (char (*) [137])
             "2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_efg);
  std::__cxx11::string::~string((string *)&tree_efg);
  if (tree_b == (TaprootScriptTree)0x0) {
    testing::Message::Message((Message *)&tree_efg);
    if (local_9a8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_9a8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x144,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&tree_efg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_efg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_9a8);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[69],std::__cxx11::string>
            ((internal *)&tree_b,
             "\"20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac\"",
             "script_j.GetHex()",(char (*) [69])0x37ae44,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree_efg);
  std::__cxx11::string::~string((string *)&tree_efg);
  if (tree_b == (TaprootScriptTree)0x0) {
    testing::Message::Message((Message *)&tree_efg);
    if (local_9a8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_9a8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x145,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&tree_efg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree_efg);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_9a8);
  std::__cxx11::string::string((string *)&tree_efg,"a",(allocator *)&tree_b);
  cfd::core::Script::Script(&local_628,&script_a);
  local_5f0 = 4;
  std::__cxx11::string::string
            (local_5e8,
             "4b3bb79ea92e0b4f2bfa7e8c88d81133e347da393d72a37fe9cdcf1f5f56b5e0e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,(allocator *)&tree);
  std::__cxx11::string::string(local_5c8,"b",(allocator *)&nodes);
  cfd::core::Script::Script(&local_5a8,&script_b);
  local_570 = 5;
  std::__cxx11::string::string
            (local_568,
             "06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,(allocator *)&gtest_ar_10);
  std::__cxx11::string::string(local_548,"c",(allocator *)&gtest_ar_9);
  cfd::core::Script::Script(&local_528,&script_c);
  local_4f0 = 5;
  std::__cxx11::string::string
            (local_4e8,
             "a85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d6754691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,(allocator *)&gtest_ar_13);
  std::__cxx11::string::string(local_4c8,"d",(allocator *)&exp_hash);
  cfd::core::Script::Script(&local_4a8,&script_d);
  local_470 = 3;
  std::__cxx11::string::string
            (local_468,
             "7da36533760cede4c164d5c00eb1500a27dd86ca76914a9874112c43e0c1b9450db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,(allocator *)&exp_str);
  std::__cxx11::string::string(local_448,"e",(allocator *)&gtest_trace_385);
  cfd::core::Script::Script(&local_428,&script_e);
  local_3f0 = 3;
  std::__cxx11::string::string
            (local_3e8,
             "aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,&local_9b9);
  std::__cxx11::string::string(local_3c8,"f",&local_9ba);
  cfd::core::Script::Script(&local_3a8,&script_f);
  local_370 = 4;
  std::__cxx11::string::string
            (local_368,
             "1aac269b1edaa45c69fb8d1a703a1bb69e90129cef7b7cfe9e676b28e6d1175d7f0ebfee6d06410937c4fd9284a322d1ca33bd1dc315a04e44c4b7df65cfccffaeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,&local_9bb);
  std::__cxx11::string::string(local_348,"g",&local_9bc);
  cfd::core::Script::Script(&local_328,&script_g);
  local_2f0 = 4;
  std::__cxx11::string::string
            (local_2e8,
             "e82da59bb829eb21f7cb8eb9eb128626da9a9a31f3dfdeb29766faf14468e9967f0ebfee6d06410937c4fd9284a322d1ca33bd1dc315a04e44c4b7df65cfccffaeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
             ,&local_9bd);
  std::__cxx11::string::string(local_2c8,"h",&local_9be);
  cfd::core::Script::Script(&local_2a8,&script_h);
  local_270 = 1;
  std::__cxx11::string::string
            (local_268,"8f43855f8d9916a2cece54e67b4ce08950a60cc3cce8907d34e03788ade5a977",&local_9bf
            );
  exp_list.super__Vector_base<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  exp_list.super__Vector_base<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  exp_list.super__Vector_base<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar3 = (pointer)operator_new(0x400);
  exp_list.super__Vector_base<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pTVar3 + 8;
  exp_list.super__Vector_base<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>._M_impl.
  super__Vector_impl_data._M_start = pTVar3;
  for (lVar5 = 0; pTVar4 = (pointer)((long)&(pTVar3->name)._M_dataplus._M_p + lVar5), lVar5 != 0x400
      ; lVar5 = lVar5 + 0x80) {
    std::__cxx11::string::string((string *)pTVar4,(string *)(&tree_efg + lVar5));
    cfd::core::Script::Script
              ((Script *)((long)&(pTVar3->script)._vptr_Script + lVar5),
               (Script *)((long)&local_628._vptr_Script + lVar5));
    *(undefined8 *)((long)&pTVar3->depth + lVar5) = *(undefined8 *)(local_5e8 + lVar5 + -8);
    std::__cxx11::string::string
              ((string *)((long)&(pTVar3->nodes)._M_dataplus._M_p + lVar5),local_5e8 + lVar5);
  }
  lVar5 = 0x380;
  exp_list.super__Vector_base<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar4;
  do {
    TestBody::TestScriptTree2Data::~TestScriptTree2Data((TestScriptTree2Data *)(&tree_efg + lVar5));
    lVar5 = lVar5 + -0x80;
  } while (lVar5 != -0x80);
  exp_hash = "ca0e12942fdb00ad71e84e02c44c0b9136e60ff2c25bcb3cade4d7dc53d246df";
  exp_str = 
  "{{{tl(20a6573124a479ab188b063bc383aa599da8ccc3b8f90fc18d570a8b367276eaf5ac),{tl(204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac),tl(2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac)}},{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),{tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac),tl(51)}},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}},tl(2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac)}"
  ;
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree_efg,&script_f);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree_b,&script_g);
  cfd::core::TaprootScriptTree::AddBranch(&tree_efg);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree_b);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree_b,&script_e);
  cfd::core::TaprootScriptTree::AddBranch(&tree_efg);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree_b);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree_b,&script_b);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&script_c);
  cfd::core::TaprootScriptTree::AddBranch(&tree_b);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&script_a);
  cfd::core::TaprootScriptTree::AddBranch(&tree_b);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&script_d);
  cfd::core::TaprootScriptTree::AddBranch(&tree_b);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  cfd::core::TaprootScriptTree::AddBranch(&tree_b);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&script_h);
  cfd::core::TaprootScriptTree::AddBranch(&tree_b);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&tree_b);
  cfd::core::TapBranch::GetCurrentBranchHash();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&gtest_ar_9,"exp_hash","tree.GetCurrentBranchHash().GetHex()",&exp_hash,
             &nodes);
  std::__cxx11::string::~string((string *)&nodes);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_10);
  if (gtest_ar_9.success_ == false) {
    testing::Message::Message((Message *)&nodes);
    if (gtest_ar_9.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x17d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&nodes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&nodes);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_9.message_);
  cfd::core::TapBranch::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&gtest_ar_10,"exp_str","tree.ToString()",&exp_str,&nodes);
  std::__cxx11::string::~string((string *)&nodes);
  if (gtest_ar_10.success_ == false) {
    testing::Message::Message((Message *)&nodes);
    if (gtest_ar_10.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x17e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9,(Message *)&nodes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&nodes);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_10.message_);
  pTVar3 = exp_list.super__Vector_base<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pTVar4 = exp_list.
                super__Vector_base<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>.
                _M_impl.super__Vector_impl_data._M_start; pTVar4 != pTVar3; pTVar4 = pTVar4 + 1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nodes,
                   "script_",&pTVar4->name);
    testing::ScopedTrace::ScopedTrace
              (&gtest_trace_385,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x181,&nodes);
    std::__cxx11::string::~string((string *)&nodes);
    std::__cxx11::string::string((string *)&gtest_ar_10,exp_str,(allocator *)&gtest_ar_13);
    gtest_ar_9.success_ = false;
    gtest_ar_9._1_7_ = 0;
    gtest_ar_9.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    cfd::core::TaprootScriptTree::FromString
              ((string *)&nodes,(Script *)&gtest_ar_10,(vector *)&pTVar4->script);
    cfd::core::TaprootScriptTree::operator=(&tree,(TaprootScriptTree *)&nodes);
    cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&nodes);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_9);
    std::__cxx11::string::~string((string *)&gtest_ar_10);
    cfd::core::TapBranch::GetCurrentBranchHash();
    cfd::core::ByteData256::GetHex_abi_cxx11_();
    testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
              ((internal *)&gtest_ar_9,"exp_hash","tree.GetCurrentBranchHash().GetHex()",&exp_hash,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nodes);
    std::__cxx11::string::~string((string *)&nodes);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_10);
    if (gtest_ar_9.success_ == false) {
      testing::Message::Message((Message *)&nodes);
      pcVar6 = "";
      if (gtest_ar_9.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x183,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&nodes);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&nodes);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_9.message_);
    cfd::core::TapBranch::ToString_abi_cxx11_();
    testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
              ((internal *)&gtest_ar_10,"exp_str","tree.ToString()",&exp_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nodes);
    std::__cxx11::string::~string((string *)&nodes);
    if (gtest_ar_10.success_ == false) {
      testing::Message::Message((Message *)&nodes);
      pcVar6 = "";
      if (gtest_ar_10.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x184,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9,(Message *)&nodes);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&nodes);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_10.message_);
    cfd::core::Script::GetHex_abi_cxx11_();
    cfd::core::TapBranch::GetScript();
    cfd::core::Script::GetHex_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_13,"test_data.script.GetHex()","tree.GetScript().GetHex()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_10,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_9);
    std::__cxx11::string::~string((string *)&gtest_ar_9);
    cfd::core::Script::~Script((Script *)&nodes);
    std::__cxx11::string::~string((string *)&gtest_ar_10);
    if (gtest_ar_13.success_ == false) {
      testing::Message::Message((Message *)&nodes);
      pcVar6 = "";
      if (gtest_ar_13.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = ((gtest_ar_13.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x185,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&nodes);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&nodes);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_13.message_);
    cfd::core::TapBranch::GetBranchList();
    gtest_ar_9._0_8_ = (long)(nodes._M_string_length - (long)nodes._M_dataplus._M_p) / 0x78;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_10,"test_data.depth","tree.GetBranchList().size()",
               &pTVar4->depth,(unsigned_long *)&gtest_ar_9);
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&nodes);
    if (gtest_ar_10.success_ == false) {
      testing::Message::Message((Message *)&nodes);
      pcVar6 = "";
      if (gtest_ar_10.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x186,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9,(Message *)&nodes);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&nodes);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_10.message_);
    nodes._M_dataplus._M_p = (pointer)&nodes.field_2;
    nodes._M_string_length = 0;
    nodes.field_2._M_local_buf[0] = '\0';
    cfd::core::TaprootScriptTree::GetNodeList();
    sVar1 = gtest_ar_9.message_;
    for (pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  gtest_ar_9._0_8_; pbVar7 != sVar1.ptr_;
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((pbVar7->field_2)._M_local_buf + 8)) {
      cfd::core::ByteData256::GetHex_abi_cxx11_();
      std::__cxx11::string::append((string *)&nodes);
      std::__cxx11::string::~string((string *)&gtest_ar_10);
    }
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &gtest_ar_9);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_10,"test_data.nodes","nodes",&pTVar4->nodes,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nodes);
    if (gtest_ar_10.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_9);
      pcVar6 = "";
      if (gtest_ar_10.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
                 ,0x189,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_13,(Message *)&gtest_ar_9);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_9);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_10.message_);
    std::__cxx11::string::~string((string *)&nodes);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_385);
  }
  std::__cxx11::string::string((string *)&gtest_ar_10,exp_str,(allocator *)&gtest_ar_13);
  gtest_ar_9.success_ = false;
  gtest_ar_9._1_7_ = 0;
  gtest_ar_9.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cfd::core::TaprootScriptTree::FromString
            ((string *)&nodes,(Script *)&gtest_ar_10,(vector *)&script_j);
  cfd::core::TaprootScriptTree::operator=(&tree,(TaprootScriptTree *)&nodes);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&nodes);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&gtest_ar_9)
  ;
  std::__cxx11::string::~string((string *)&gtest_ar_10);
  cfd::core::TapBranch::GetScript();
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar_9,"\"xxx\"","tree.GetScript().GetHex()",(char (*) [4])0x36dadd,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_10);
  std::__cxx11::string::~string((string *)&gtest_ar_10);
  cfd::core::Script::~Script((Script *)&nodes);
  if (gtest_ar_9.success_ == false) {
    testing::Message::Message((Message *)&nodes);
    if (gtest_ar_9.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_9.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,399,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&nodes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&nodes);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_9.message_);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar_10,"\"xxx\"","script_j.GetHex()",(char (*) [4])0x36dadd,&nodes);
  std::__cxx11::string::~string((string *)&nodes);
  if (gtest_ar_10.success_ == false) {
    testing::Message::Message((Message *)&nodes);
    if (gtest_ar_10.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,400,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9,(Message *)&nodes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&nodes);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_10.message_);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree_b);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree_efg);
  std::vector<TestScriptTree2Data,_std::allocator<TestScriptTree2Data>_>::~vector(&exp_list);
  cfd::core::Script::~Script(&script_j);
  cfd::core::Script::~Script(&script_h);
  cfd::core::Script::~Script(&script_g);
  cfd::core::Script::~Script(&script_f);
  cfd::core::Script::~Script(&script_e);
  cfd::core::Script::~Script(&script_d);
  cfd::core::Script::~Script(&script_c);
  cfd::core::Script::~Script(&script_b);
  cfd::core::Script::~Script(&script_a);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey32);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey31);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey22);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey21);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey12);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey11);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return;
}

Assistant:

TEST(TaprootScriptTree, TreeTest2) {
  //        /\        //
  //       /\ H       //
  //      /  \        //
  //     /\  /\       //
  //    /  D E \      //
  //   / \     /\     //
  //  A   /\  F  G    //
  //     B  C         //
  Privkey key("dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8");
  ByteData256 tweak1("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  ByteData256 tweak2("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57");
  ByteData256 tweak3("a78120a2d338fce91a49230935e8f000672f9511ee6fa5fc35ef22f0dfc89475");
  ByteData256 tweak4("4b79048979258d39c31b10f2bda70a433daa6e42f987089053f00db1d0f94a8e");
  Pubkey pubkey1 = key.GeneratePubkey();
  Pubkey pubkey2 = pubkey1 + tweak3;
  Pubkey pubkey3 = pubkey1 + tweak4;
  SchnorrPubkey schnorr_pubkey1 = SchnorrPubkey::FromPubkey(pubkey1);
  SchnorrPubkey schnorr_pubkey11 = schnorr_pubkey1 + tweak1;
  SchnorrPubkey schnorr_pubkey12 = schnorr_pubkey1 + tweak2;
  SchnorrPubkey schnorr_pubkey2 = SchnorrPubkey::FromPubkey(pubkey2);
  SchnorrPubkey schnorr_pubkey21 = schnorr_pubkey2 + tweak1;
  SchnorrPubkey schnorr_pubkey22 = schnorr_pubkey2 + tweak2;
  SchnorrPubkey schnorr_pubkey3 = SchnorrPubkey::FromPubkey(pubkey3);
  SchnorrPubkey schnorr_pubkey31 = schnorr_pubkey3 + tweak1;
  SchnorrPubkey schnorr_pubkey32 = schnorr_pubkey3 + tweak2;

  Script script_a = (ScriptBuilder() << schnorr_pubkey1.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_b = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  Script script_c = (ScriptBuilder() << schnorr_pubkey11.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script script_d = (ScriptBuilder() << schnorr_pubkey11.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey12.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  // Script script_e = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  Script script_e = (ScriptBuilder() << schnorr_pubkey2.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_f = (ScriptBuilder() << schnorr_pubkey21.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_g = (ScriptBuilder() << schnorr_pubkey22.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script script_h = (ScriptBuilder() << schnorr_pubkey31.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey32.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_j = (ScriptBuilder() << schnorr_pubkey32.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  EXPECT_EQ("20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac", script_a.GetHex());
  EXPECT_EQ("51", script_b.GetHex());
  EXPECT_EQ("2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac", script_c.GetHex());
  EXPECT_EQ("2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac", script_d.GetHex());
  EXPECT_EQ("20a6573124a479ab188b063bc383aa599da8ccc3b8f90fc18d570a8b367276eaf5ac", script_e.GetHex());
  EXPECT_EQ("2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac", script_f.GetHex());
  EXPECT_EQ("204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac", script_g.GetHex());
  EXPECT_EQ("2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac", script_h.GetHex());
  EXPECT_EQ("20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac", script_j.GetHex());

  struct TestScriptTree2Data {
    std::string name;
    Script script;
    size_t depth;
    std::string nodes;
  };
  std::vector<TestScriptTree2Data> exp_list = {
    {
      "a", script_a, 4,
      "4b3bb79ea92e0b4f2bfa7e8c88d81133e347da393d72a37fe9cdcf1f5f56b5e0e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "b", script_b, 5,
      "06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "c", script_c, 5,
      "a85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d6754691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "d", script_d, 3,
      "7da36533760cede4c164d5c00eb1500a27dd86ca76914a9874112c43e0c1b9450db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "e", script_e, 3,
      "aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "f", script_f, 4,
      "1aac269b1edaa45c69fb8d1a703a1bb69e90129cef7b7cfe9e676b28e6d1175d7f0ebfee6d06410937c4fd9284a322d1ca33bd1dc315a04e44c4b7df65cfccffaeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "g", script_g, 4,
      "e82da59bb829eb21f7cb8eb9eb128626da9a9a31f3dfdeb29766faf14468e9967f0ebfee6d06410937c4fd9284a322d1ca33bd1dc315a04e44c4b7df65cfccffaeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "h", script_h, 1, "8f43855f8d9916a2cece54e67b4ce08950a60cc3cce8907d34e03788ade5a977"
    },
  };

  auto exp_hash = "ca0e12942fdb00ad71e84e02c44c0b9136e60ff2c25bcb3cade4d7dc53d246df";
  auto exp_str = "{{{tl(20a6573124a479ab188b063bc383aa599da8ccc3b8f90fc18d570a8b367276eaf5ac),{tl(204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac),tl(2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac)}},{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),{tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac),tl(51)}},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}},tl(2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac)}";
  TaprootScriptTree tree_efg(script_f);
  tree_efg.AddBranch(TaprootScriptTree(script_g));
  tree_efg.AddBranch(TaprootScriptTree(script_e));

  TaprootScriptTree tree_b(script_b);
  tree_b.AddBranch(TaprootScriptTree(script_c));
  tree_b.AddBranch(TaprootScriptTree(script_a));
  tree_b.AddBranch(TaprootScriptTree(script_d));
  tree_b.AddBranch(tree_efg);
  tree_b.AddBranch(TaprootScriptTree(script_h));

  TaprootScriptTree tree = tree_b;
  EXPECT_EQ(exp_hash, tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, tree.ToString());

  for (const auto& test_data : exp_list) {
    SCOPED_TRACE("script_" + test_data.name);
    tree = TaprootScriptTree::FromString(exp_str, test_data.script);
    EXPECT_EQ(exp_hash, tree.GetCurrentBranchHash().GetHex());
    EXPECT_EQ(exp_str, tree.ToString());
    EXPECT_EQ(test_data.script.GetHex(), tree.GetScript().GetHex());
    EXPECT_EQ(test_data.depth, tree.GetBranchList().size());
    std::string nodes;
    for (const auto& node : tree.GetNodeList()) nodes += node.GetHex();
    EXPECT_EQ(test_data.nodes, nodes);
  }

  // invalid leaf
  try {
    tree = TaprootScriptTree::FromString(exp_str, script_j);
    EXPECT_EQ("xxx", tree.GetScript().GetHex());
    EXPECT_EQ("xxx", script_j.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ(
      "This tapscript not exist in this tree.",
      except.what());
  }
}